

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O0

void __thiscall Reset_takeNonExistentReset_Test::TestBody(Reset_takeNonExistentReset_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_120 [8];
  Message local_118 [8];
  unsigned_long local_110 [2];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8 [8];
  undefined1 local_e0 [16];
  AssertionResult gtest_ar_1;
  ResetPtr taken_r;
  Message local_b0 [8];
  unsigned_long local_a8 [2];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  AssertHelper local_68 [8];
  Message local_60 [31];
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  ResetPtr r;
  ComponentPtr c;
  Reset_takeNonExistentReset_Test *this_local;
  
  libcellml::Component::create();
  libcellml::Reset::create();
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  bVar1 = libcellml::Component::addReset((shared_ptr *)peVar3);
  local_41 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_40,&local_41,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar2) {
    testing::Message::Message(local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_40,"c->addReset(r)","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x13b,pcVar4);
    testing::internal::AssertHelper::operator=(local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_a8[1] = 1;
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a8[0] = libcellml::Component::resetCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"size_t(1)","c->resetCount()",local_a8 + 1,local_a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(local_b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &taken_r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x13c,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &taken_r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &taken_r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Component::takeReset((ulong)&gtest_ar_1.message_);
  local_e0._0_8_ = (element_type *)0x0;
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_e0 + 8,"nullptr",(void **)"taken_r",(shared_ptr<libcellml::Reset> *)local_e0,
             &gtest_ar_1.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_e0 + 8));
  if (!bVar2) {
    testing::Message::Message(local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)(local_e0 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x140,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_e0 + 8));
  local_110[1] = 1;
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_110[0] = libcellml::Component::resetCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_100,"size_t(1)","c->resetCount()",local_110 + 1,local_110);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar2) {
    testing::Message::Message(local_118);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x141,pcVar4);
    testing::internal::AssertHelper::operator=(local_120,local_118);
    testing::internal::AssertHelper::~AssertHelper(local_120);
    testing::Message::~Message(local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::shared_ptr<libcellml::Reset>::~shared_ptr
            ((shared_ptr<libcellml::Reset> *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Reset>::~shared_ptr
            ((shared_ptr<libcellml::Reset> *)&gtest_ar_.message_);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Reset, takeNonExistentReset)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::ResetPtr r = libcellml::Reset::create();

    // Add r to c.
    EXPECT_TRUE(c->addReset(r));
    EXPECT_EQ(size_t(1), c->resetCount());

    // Retrieve a non-existent reset from c.
    auto taken_r = c->takeReset(1);
    EXPECT_EQ(nullptr, taken_r);
    EXPECT_EQ(size_t(1), c->resetCount());
}